

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O0

fan_t mahjong::get_3_chows_fan(tile_t t0,tile_t t1,tile_t t2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool local_41;
  rank_t r2;
  rank_t r1;
  rank_t r0;
  suit_t s2;
  suit_t s1;
  suit_t s0;
  tile_t t2_local;
  tile_t t1_local;
  tile_t t0_local;
  
  bVar1 = t0 & 0xf;
  bVar2 = t1 & 0xf;
  bVar3 = t2 & 0xf;
  bVar4 = false;
  if (((int)(uint)t0 >> 4 != (int)(uint)t1 >> 4) &&
     (bVar4 = false, (int)(uint)t0 >> 4 != (int)(uint)t2 >> 4)) {
    bVar4 = (int)(uint)t1 >> 4 != (int)(uint)t2 >> 4;
  }
  if (bVar4) {
    local_41 = true;
    if (((((byte)(bVar1 + 1) != bVar2 || (byte)(bVar2 + 1) != bVar3) &&
         (local_41 = true, (byte)(bVar3 + 1) != bVar2 || (byte)(bVar2 + 1) != bVar1)) &&
        (local_41 = true, (byte)(bVar2 + 1) != bVar1 || (byte)(bVar1 + 1) != bVar3)) &&
       ((local_41 = true, (byte)(bVar3 + 1) != bVar1 || (byte)(bVar1 + 1) != bVar2 &&
        (local_41 = true, (byte)(bVar2 + 1) != bVar3 || (byte)(bVar3 + 1) != bVar1)))) {
      local_41 = (byte)(bVar1 + 1) == bVar3 && (byte)(bVar3 + 1) == bVar2;
    }
    if (local_41) {
      return MIXED_SHIFTED_CHOWS;
    }
    if ((bVar1 == bVar2) && (bVar2 == bVar3)) {
      return MIXED_TRIPLE_CHOW;
    }
    if (((((((bVar1 == 2) && (bVar2 == 5)) && (bVar3 == 8)) ||
          (((bVar1 == 2 && (bVar2 == 8)) && (bVar3 == 5)))) ||
         (((bVar1 == 5 && (bVar2 == 2)) && (bVar3 == 8)))) ||
        ((((bVar1 == 5 && (bVar2 == 8)) && (bVar3 == 2)) ||
         (((bVar1 == 8 && (bVar2 == 2)) && (bVar3 == 5)))))) ||
       (((bVar1 == 8 && (bVar2 == 5)) && (bVar3 == 2)))) {
      return MIXED_STRAIGHT;
    }
  }
  else {
    if ((t0 + 3 == (uint)t1) && (t1 + 3 == (uint)t2)) {
      return PURE_STRAIGHT;
    }
    if ((t0 + 2 == (uint)t1 && t1 + 2 == (uint)t2) || (t0 + 1 == (uint)t1 && t1 + 1 == (uint)t2)) {
      return PURE_SHIFTED_CHOWS;
    }
    if ((t0 == t1) && (t0 == t2)) {
      return PURE_TRIPLE_CHOW;
    }
  }
  return FAN_NONE;
}

Assistant:

static fan_t get_3_chows_fan(tile_t t0, tile_t t1, tile_t t2) {
    suit_t s0 = tile_get_suit(t0);
    suit_t s1 = tile_get_suit(t1);
    suit_t s2 = tile_get_suit(t2);

    rank_t r0 = tile_get_rank(t0);
    rank_t r1 = tile_get_rank(t1);
    rank_t r2 = tile_get_rank(t2);

    // 按出现频率顺序

    if (is_mixed(s0, s1, s2)) {  // 三色
        // 三色三步高
        if (is_shifted_1_unordered(r1, r0, r2)) {
            return MIXED_SHIFTED_CHOWS;
        }
        // 三色三同顺
        if (r0 == r1 && r1 == r2) {
            return MIXED_TRIPLE_CHOW;
        }
        // 花龙
        if ((r0 == 2 && r1 == 5 && r2 == 8) || (r0 == 2 && r1 == 8 && r2 == 5)
            || (r0 == 5 && r1 == 2 && r2 == 8) || (r0 == 5 && r1 == 8 && r2 == 2)
            || (r0 == 8 && r1 == 2 && r2 == 5) || (r0 == 8 && r1 == 5 && r2 == 2)) {
            return MIXED_STRAIGHT;
        }
    }
    else {  // 一色
        // 清龙
        if (t0 + 3 == t1 && t1 + 3 == t2) {
            return PURE_STRAIGHT;
        }
        // 一色三步高
        if (is_shifted_2(t0, t1, t2) || is_shifted_1(t0, t1, t2)) {
            return PURE_SHIFTED_CHOWS;
        }
        // 一色三同顺
        if (t0 == t1 && t0 == t2) {
            return PURE_TRIPLE_CHOW;
        }
    }
    // 以上都没有
    return FAN_NONE;
}